

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O1

bool google::protobuf::compiler::GenerateCode
               (CodeGeneratorRequest *request,CodeGenerator *generator,
               CodeGeneratorResponse *response,string *error_msg)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  CodeGeneratorResponse *pCVar1;
  unique_ptr<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
  uVar2;
  int iVar3;
  FeatureSetDefaults *from;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *proto;
  FileDescriptor *pFVar4;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar5;
  undefined4 extraout_var;
  Arena *arena;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  undefined1 *compiler_version;
  ulong uVar9;
  string_view name;
  string_view v;
  Status status;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  GeneratorResponseContext context;
  string error;
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  DescriptorPool pool;
  undefined1 local_1f0 [8];
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_1e8;
  CodeGeneratorResponse *local_1d0;
  DescriptorPool *local_1c8;
  unique_ptr<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
  local_1c0;
  GeneratorResponseContext local_1b8;
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  string local_140;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_120 [8];
  FeatureSetDefaults local_e0;
  DescriptorPool local_a8;
  
  local_1d0 = response;
  DescriptorPool::DescriptorPool(&local_a8);
  local_1c0._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
  .
  super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>,_true,_true>
        )(__uniq_ptr_data<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>,_true,_true>
          )generator;
  CodeGenerator::BuildFeatureSetDefaults
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_120[0].status_,generator);
  if (local_120[0] ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x1) {
    from = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::value
                     ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_120[0].status_);
    FeatureSetDefaults::FeatureSetDefaults(&local_e0,(Arena *)0x0,from);
    DescriptorPool::SetFeatureSetDefaults
              ((DescriptorPool *)local_1f0,(FeatureSetDefaults *)&local_a8);
    FeatureSetDefaults::~FeatureSetDefaults(&local_e0);
    if (local_1f0 != (undefined1  [8])0x1) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.cc"
                 ,0x6f,"status.ok()");
      if (((ulong)local_1f0 & 1) == 0) {
        pcVar6 = (((string *)((long)local_1f0 + 8))->_M_dataplus)._M_p;
        uVar9 = *(size_type *)((long)local_1f0 + 0x10);
      }
      else {
        uVar9 = (ulong)((uint)(((long)local_1f0 << 0x3e) >> 0x3f) & 0x1b);
        pcVar6 = (char *)(((long)local_1f0 << 0x3e) >> 0x3f & 0x2e9f10);
      }
      v._M_str = pcVar6;
      v._M_len = uVar9;
      absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_1b8,v);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1b8);
    }
    if (0 < *(int *)((long)&request->field_0 + 0x28)) {
      iVar8 = 0;
      do {
        proto = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                          (&(request->field_0)._impl_.proto_file_.super_RepeatedPtrFieldBase,iVar8);
        pFVar4 = DescriptorPool::BuildFile(&local_a8,proto);
        if (pFVar4 == (FileDescriptor *)0x0) {
          bVar7 = false;
          goto LAB_001443f3;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < *(int *)((long)&request->field_0 + 0x28));
    }
    local_1e8.
    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar8 = *(int *)((long)&request->field_0 + 0x10);
    bVar7 = iVar8 < 1;
    if (0 < iVar8) {
      this = &(request->field_0)._impl_.file_to_generate_;
      iVar8 = 0;
      local_1c8 = (DescriptorPool *)error_msg;
      do {
        pVVar5 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                           (&this->super_RepeatedPtrFieldBase,iVar8);
        name._M_str = (pVVar5->_M_dataplus)._M_p;
        name._M_len = pVVar5->_M_string_length;
        local_1b8.super_GeneratorContext._vptr_GeneratorContext =
             (_func_int **)DescriptorPool::FindFileByName(&local_a8,name);
        std::
        vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::emplace_back<google::protobuf::FileDescriptor_const*>
                  ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
                    *)&local_1e8,(FileDescriptor **)&local_1b8);
        if ((((Mutex *)
             (local_1e8.
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1))->mu_).super___atomic_base<long>._M_i
            == 0) {
          local_1b8.super_GeneratorContext._vptr_GeneratorContext = (_func_int **)0x56;
          local_1b8.compiler_version_.super_Message.super_MessageLite._vptr_MessageLite =
               (_func_int **)0x2e9dad;
          pVVar5 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                             (&this->super_RepeatedPtrFieldBase,iVar8);
          local_170._8_8_ = (pVVar5->_M_dataplus)._M_p;
          local_170._0_8_ = pVVar5->_M_string_length;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_140,(lts_20250127 *)&local_1b8,(AlphaNum *)local_170,
                     (AlphaNum *)local_170._8_8_);
          std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001443dc;
        }
        iVar8 = iVar8 + 1;
        iVar3 = *(int *)((long)&request->field_0 + 0x10);
        bVar7 = iVar3 <= iVar8;
      } while (iVar8 < iVar3);
    }
    compiler_version = (undefined1 *)(request->field_0)._impl_.compiler_version_;
    if ((Version *)compiler_version == (Version *)0x0) {
      compiler_version = _Version_default_instance_;
    }
    GeneratorResponseContext::GeneratorResponseContext
              (&local_1b8,(Version *)compiler_version,local_1d0,&local_1e8);
    uVar2._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
    .
    super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
    ._M_head_impl =
         local_1c0._M_t.
         super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
         .
         super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
         ._M_head_impl;
    local_170._8_8_ = (AlphaNum *)0x0;
    local_160[0] = '\0';
    local_170._0_8_ = (AlphaNum *)local_160;
    iVar8 = (*(*(_func_int ***)
                local_1c0._M_t.
                super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                .
                super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                ._M_head_impl)[3])
                      (local_1c0._M_t.
                       super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                       .
                       super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                       ._M_head_impl,&local_1e8,
                       (ulong)(request->field_0)._impl_.parameter_.tagged_ptr_.ptr_ &
                       0xfffffffffffffffc,&local_1b8,local_170);
    pCVar1 = local_1d0;
    iVar3 = (*(*(_func_int ***)
                uVar2._M_t.
                super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                .
                super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                ._M_head_impl)[4])
                      (uVar2._M_t.
                       super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                       .
                       super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                       ._M_head_impl);
    (pCVar1->field_0)._impl_.supported_features_ = CONCAT44(extraout_var,iVar3);
    *(byte *)&pCVar1->field_0 = *(byte *)&pCVar1->field_0 | 2;
    iVar3 = (*(*(_func_int ***)
                uVar2._M_t.
                super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                .
                super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                ._M_head_impl)[7])
                      (uVar2._M_t.
                       super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                       .
                       super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                       ._M_head_impl);
    (pCVar1->field_0)._impl_.minimum_edition_ = iVar3;
    *(byte *)&pCVar1->field_0 = *(byte *)&pCVar1->field_0 | 4;
    iVar3 = (*(*(_func_int ***)
                uVar2._M_t.
                super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                .
                super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                ._M_head_impl)[8])
                      (uVar2._M_t.
                       super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                       .
                       super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                       ._M_head_impl);
    (pCVar1->field_0)._impl_.maximum_edition_ = iVar3;
    *(byte *)&pCVar1->field_0 = *(byte *)&pCVar1->field_0 | 8;
    if (((char)iVar8 == '\0') && ((AlphaNum *)local_170._8_8_ == (AlphaNum *)0x0)) {
      std::__cxx11::string::_M_replace((ulong)local_170,0,(char *)0x0,0x2e9b00);
    }
    if ((AlphaNum *)local_170._8_8_ != (AlphaNum *)0x0) {
      *(byte *)&pCVar1->field_0 = *(byte *)&pCVar1->field_0 | 1;
      arena = (Arena *)(pCVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>(&(pCVar1->field_0)._impl_.error_,(string *)local_170,arena);
    }
    if ((AlphaNum *)local_170._0_8_ != (AlphaNum *)local_160) {
      operator_delete((void *)local_170._0_8_,CONCAT71(local_160._1_7_,local_160[0]) + 1);
    }
    local_1b8.super_GeneratorContext._vptr_GeneratorContext =
         (_func_int **)&PTR__GeneratorResponseContext_0046a228;
    Version::~Version(&local_1b8.compiler_version_);
    GeneratorContext::~GeneratorContext(&local_1b8.super_GeneratorContext);
LAB_001443dc:
    if ((flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
         *)local_1e8.
           super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_start !=
        (flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
         *)0x0) {
      operator_delete(local_1e8.
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
LAB_001443f3:
    if (((ulong)local_1f0 & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_1f0);
    }
  }
  else {
    local_1b8.super_GeneratorContext._vptr_GeneratorContext = (_func_int **)0x23;
    local_1b8.compiler_version_.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)0x2e9d09;
    if (((ulong)local_120[0] & 1) == 0) {
      local_170._8_8_ = *(undefined8 *)((long)local_120[0] + 8);
      local_170._0_8_ = *(undefined8 *)((long)local_120[0] + 0x10);
    }
    else {
      local_170._0_8_ = ZEXT48((uint)(((long)local_120[0] << 0x3e) >> 0x3f) & 0x1b);
      local_170._8_8_ = ((long)local_120[0] << 0x3e) >> 0x3f & 0x2e9f10;
    }
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_140,(lts_20250127 *)&local_1b8,(AlphaNum *)local_170,
               (AlphaNum *)local_170._0_8_);
    std::__cxx11::string::operator=((string *)error_msg,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    bVar7 = false;
  }
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
  ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)&local_120[0].status_);
  DescriptorPool::~DescriptorPool(&local_a8);
  return bVar7;
}

Assistant:

bool GenerateCode(const CodeGeneratorRequest& request,
                  const CodeGenerator& generator,
                  CodeGeneratorResponse* response, std::string* error_msg) {
  DescriptorPool pool;

  // Initialize feature set default mapping.
  absl::StatusOr<FeatureSetDefaults> defaults =
      generator.BuildFeatureSetDefaults();
  if (!defaults.ok()) {
    *error_msg = absl::StrCat("error generating feature defaults: ",
                              defaults.status().message());
    return false;
  }
  absl::Status status = pool.SetFeatureSetDefaults(std::move(defaults).value());
  ABSL_CHECK(status.ok()) << status.message();

  for (int i = 0; i < request.proto_file_size(); i++) {
    const FileDescriptor* file = pool.BuildFile(request.proto_file(i));
    if (file == nullptr) {
      // BuildFile() already wrote an error message.
      return false;
    }
  }

  std::vector<const FileDescriptor*> parsed_files;
  for (int i = 0; i < request.file_to_generate_size(); i++) {
    parsed_files.push_back(pool.FindFileByName(request.file_to_generate(i)));
    if (parsed_files.back() == nullptr) {
      *error_msg = absl::StrCat(
          "protoc asked plugin to generate a file but "
          "did not provide a descriptor for the file: ",
          request.file_to_generate(i));
      return false;
    }
  }

  GeneratorResponseContext context(request.compiler_version(), response,
                                   parsed_files);


  std::string error;
  bool succeeded = generator.GenerateAll(parsed_files, request.parameter(),
                                         &context, &error);

  response->set_supported_features(generator.GetSupportedFeatures());
  response->set_minimum_edition(
      static_cast<int>(generator.GetMinimumEdition()));
  response->set_maximum_edition(
      static_cast<int>(generator.GetMaximumEdition()));

  if (!succeeded && error.empty()) {
    error =
        "Code generator returned false but provided no error "
        "description.";
  }
  if (!error.empty()) {
    response->set_error(error);
  }

  return true;
}